

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstest.c
# Opt level: O3

int main(void)

{
  int iVar1;
  undefined8 in_RAX;
  bitstream *pbVar2;
  char *__format;
  uint32_t val;
  int32_t sval;
  undefined8 local_18;
  
  local_18._4_4_ = (int)((ulong)in_RAX >> 0x20);
  pbVar2 = vs_new_encode(VS_H264);
  local_18._0_4_ = 0xde;
  iVar1 = vs_start(pbVar2,(uint32_t *)&local_18);
  if (iVar1 == 0) {
    local_18._0_4_ = 0x123;
    iVar1 = vs_u(pbVar2,(uint32_t *)&local_18,0xc);
    if (iVar1 == 0) {
      local_18._0_4_ = 0x456;
      iVar1 = vs_u(pbVar2,(uint32_t *)&local_18,0xc);
      if (iVar1 == 0) {
        local_18._0_4_ = 8;
        iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
        if (iVar1 == 0) {
          local_18._0_4_ = 7;
          iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
          if (iVar1 == 0) {
            local_18 = CONCAT44(local_18._4_4_,6);
            iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
            if (iVar1 == 0) {
              local_18 = local_18 & 0xffffffff;
              iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
              if (iVar1 == 0) {
                local_18 = CONCAT44(0xfffffffd,(uint32_t)local_18);
                iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
                if (iVar1 == 0) {
                  local_18._4_4_ = 3;
                  iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
                  if ((iVar1 == 0) && (iVar1 = vs_end(pbVar2), iVar1 == 0)) {
                    fwrite(pbVar2->bytes,(long)pbVar2->bytesnum,1,_stdout);
                    pbVar2 = vs_new_decode(VS_H264,pbVar2->bytes,pbVar2->bytesnum);
                    iVar1 = vs_start(pbVar2,(uint32_t *)&local_18);
                    if (iVar1 == 0) {
                      if ((uint32_t)local_18 == 0xde) {
                        iVar1 = vs_u(pbVar2,(uint32_t *)&local_18,0xc);
                        if (iVar1 == 0) {
                          if ((uint32_t)local_18 == 0x123) {
                            iVar1 = vs_u(pbVar2,(uint32_t *)&local_18,0xc);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            if ((uint32_t)local_18 == 0x456) {
                              iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
                              if (iVar1 != 0) {
                                return 1;
                              }
                              if ((uint32_t)local_18 == 8) {
                                iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
                                if (iVar1 != 0) {
                                  return 1;
                                }
                                if ((uint32_t)local_18 == 7) {
                                  iVar1 = vs_ue(pbVar2,(uint32_t *)&local_18);
                                  if (iVar1 != 0) {
                                    return 1;
                                  }
                                  if ((uint32_t)local_18 == 6) {
                                    iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
                                    if (iVar1 != 0) {
                                      return 1;
                                    }
                                    if (local_18._4_4_ == 0) {
                                      iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
                                      if (iVar1 != 0) {
                                        return 1;
                                      }
                                      if (local_18._4_4_ == -3) {
                                        iVar1 = vs_se(pbVar2,(int32_t *)((long)&local_18 + 4));
                                        if (iVar1 != 0) {
                                          return 1;
                                        }
                                        if (local_18._4_4_ == 3) {
                                          iVar1 = vs_end(pbVar2);
                                          if (iVar1 != 0) {
                                            return 1;
                                          }
                                          if ((pbVar2->bytepos == pbVar2->bytesnum) &&
                                             (pbVar2->hasbyte == 0)) {
                                            main_cold_3();
                                            return 0;
                                          }
                                          main_cold_2();
                                          return 1;
                                        }
                                        __format = "Fail 9: %x\n";
                                      }
                                      else {
                                        __format = "Fail 8: %x\n";
                                      }
                                    }
                                    else {
                                      __format = "Fail 7: %x\n";
                                    }
                                  }
                                  else {
                                    __format = "Fail 6: %x\n";
                                  }
                                }
                                else {
                                  __format = "Fail 5: %x\n";
                                }
                              }
                              else {
                                __format = "Fail 4: %x\n";
                              }
                            }
                            else {
                              __format = "Fail 3: %x\n";
                            }
                          }
                          else {
                            __format = "Fail 2: %x\n";
                          }
                          fprintf(_stderr,__format);
                        }
                      }
                      else {
                        main_cold_1();
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main() {
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	int32_t sval;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;
	val = 0x123;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x456;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x8;
	if (vs_ue(str, &val))
		return 1;
	val = 0x7;
	if (vs_ue(str, &val))
		return 1;
	val = 0x6;
	if (vs_ue(str, &val))
		return 1;
	sval = 0;
	if (vs_se(str, &sval))
		return 1;
	sval = -3;
	if (vs_se(str, &sval))
		return 1;
	sval = 3;
	if (vs_se(str, &sval))
		return 1;
	if (vs_end(str))
		return 1;
	fwrite(str->bytes, str->bytesnum, 1, stdout);
	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x123) {
		fprintf (stderr, "Fail 2: %x\n", val);
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x456) {
		fprintf (stderr, "Fail 3: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x8) {
		fprintf (stderr, "Fail 4: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x7) {
		fprintf (stderr, "Fail 5: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x6) {
		fprintf (stderr, "Fail 6: %x\n", val);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 0) {
		fprintf (stderr, "Fail 7: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != -3) {
		fprintf (stderr, "Fail 8: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 3) {
		fprintf (stderr, "Fail 9: %x\n", sval);
		return 1;
	}

	if (vs_end(nstr))
		return 1;
	if (nstr->bytepos != nstr->bytesnum || nstr->hasbyte) {
		fprintf (stderr, "Bitstream not fully consumed!\n");
		return 1;
	}
	fprintf (stderr, "All ok!\n");

	return 0;
}